

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

bool __thiscall QSQLiteDriver::rollbackTransaction(QSQLiteDriver *this)

{
  undefined1 uVar1;
  ulong uVar2;
  QSqlResult *pQVar3;
  long *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QSqlQuery q;
  undefined4 in_stack_ffffffffffffff4c;
  uint n;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  bool local_81;
  QLatin1StringView in_stack_ffffffffffffff80;
  QSqlError local_68 [8];
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  QSqlError local_30 [32];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (**(code **)(*in_RDI + 0x60))();
  if (((uVar2 & 1) == 0) || (uVar2 = QSqlDriver::isOpenError(), (uVar2 & 1) != 0)) {
    local_81 = false;
  }
  else {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = (QSqlResult *)(**(code **)(*in_RDI + 200))();
    QSqlQuery::QSqlQuery((QSqlQuery *)&local_10,pQVar3);
    QVar4 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       (size_t)in_RDI);
    QString::QString((QString *)QVar4.m_size,in_stack_ffffffffffffff80);
    uVar1 = QSqlQuery::exec((QString *)&local_10);
    n = CONCAT13(uVar1,(int3)in_stack_ffffffffffffff4c) ^ 0xff000000;
    QString::~QString((QString *)0x118ac8);
    local_81 = (n & 0x1000000) != 0;
    if (local_81) {
      tr((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(char *)in_RDI,n);
      QSqlQuery::lastError();
      QSqlError::databaseText();
      QString::QString((QString *)0x118b1a);
      QSqlError::QSqlError
                (local_30,(QString *)local_48,(QString *)local_60,TransactionError,
                 (QString *)&stack0xffffffffffffff80);
      (**(code **)(*in_RDI + 0x120))(in_RDI,local_30);
      QSqlError::~QSqlError(local_30);
      QString::~QString((QString *)0x118b68);
      QString::~QString((QString *)0x118b72);
      QSqlError::~QSqlError(local_68);
      QString::~QString((QString *)0x118b86);
    }
    local_81 = !local_81;
    QSqlQuery::~QSqlQuery((QSqlQuery *)&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_81;
}

Assistant:

bool QSQLiteDriver::rollbackTransaction()
{
    if (!isOpen() || isOpenError())
        return false;

    QSqlQuery q(createResult());
    if (!q.exec("ROLLBACK"_L1)) {
        setLastError(QSqlError(tr("Unable to rollback transaction"),
                               q.lastError().databaseText(), QSqlError::TransactionError));
        return false;
    }

    return true;
}